

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineOutputFile.cpp
# Opt level: O0

void __thiscall
Imf_2_5::DeepScanLineOutputFile::DeepScanLineOutputFile
          (DeepScanLineOutputFile *this,OutputPartData *part)

{
  bool bVar1;
  ArgExc *this_00;
  _func_int **pp_Var2;
  long in_RSI;
  GenericOutputFile *in_RDI;
  stringstream _iex_replace_s;
  BaseExc *e;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe10;
  Header *in_stack_fffffffffffffe68;
  DeepScanLineOutputFile *in_stack_fffffffffffffe70;
  int in_stack_fffffffffffffe8c;
  Data *in_stack_fffffffffffffe90;
  
  GenericOutputFile::GenericOutputFile(in_RDI);
  in_RDI->_vptr_GenericOutputFile = (_func_int **)&PTR__DeepScanLineOutputFile_00562a00;
  Header::type_abi_cxx11_((Header *)0x2e05d9);
  bVar1 = std::operator!=(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  if (!bVar1) {
    pp_Var2 = (_func_int **)operator_new(0x180);
    Data::Data(in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c);
    in_RDI[1]._vptr_GenericOutputFile = pp_Var2;
    in_RDI[1]._vptr_GenericOutputFile[0x2e] = *(_func_int **)(in_RSI + 0x58);
    *(undefined1 *)(in_RDI[1]._vptr_GenericOutputFile + 0x2f) = 0;
    initialize(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
    *(undefined4 *)((long)in_RDI[1]._vptr_GenericOutputFile + 0x144) =
         *(undefined4 *)(in_RSI + 0x4c);
    in_RDI[1]._vptr_GenericOutputFile[0x24] = *(_func_int **)(in_RSI + 0x38);
    in_RDI[1]._vptr_GenericOutputFile[8] = *(_func_int **)(in_RSI + 0x40);
    *(byte *)((long)in_RDI[1]._vptr_GenericOutputFile + 0x3c) = *(byte *)(in_RSI + 0x50) & 1;
    return;
  }
  this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_2_5::ArgExc::ArgExc
            (this_00,"Can\'t build a DeepScanLineOutputFile from a type-mismatched part.");
  __cxa_throw(this_00,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
}

Assistant:

DeepScanLineOutputFile::DeepScanLineOutputFile(const OutputPartData* part)
{
    try
    {
        if (part->header.type() != DEEPSCANLINE)
            throw IEX_NAMESPACE::ArgExc("Can't build a DeepScanLineOutputFile from a type-mismatched part.");

        _data = new Data (part->numThreads);
        _data->_streamData = part->mutex;
        _data->_deleteStream=false;
        initialize (part->header);
        _data->partNumber = part->partNumber;
        _data->lineOffsetsPosition = part->chunkOffsetTablePosition;
        _data->previewPosition = part->previewPosition;
	_data->multipart=part->multipart;
    }
    catch (IEX_NAMESPACE::BaseExc &e)
    {
        delete _data;

        REPLACE_EXC (e, "Cannot initialize output part "
                     "\"" << part->partNumber << "\". " << e.what());
        throw;
    }
    catch (...)
    {
        delete _data;
        throw;
    }
}